

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O3

void __thiscall
ServeStaticContent_MissingFile_Test::TestBody(ServeStaticContent_MissingFile_Test *this)

{
  char *message;
  error_code eVar1;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  error_code local_48;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/foo.html","");
  anon_unknown.dwarf_11ce1b::ServeStaticContent::serve_path
            (&local_38,&this->super_ServeStaticContent,local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,(ulong)(local_68._M_dataplus._M_p + 1));
  }
  eVar1 = pstore::
          error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::get_error(&local_38);
  local_68.field_2._8_8_ = eVar1._M_cat;
  local_68.field_2._M_allocated_capacity._0_4_ = eVar1._M_value;
  eVar1 = pstore::romfs::make_error_code(enoent);
  local_48._M_cat = eVar1._M_cat;
  local_48._M_value = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_78,"actual.get_error ()",
             "make_error_code (pstore::romfs::error_code::enoent)",(error_code *)&local_68.field_2,
             &local_48);
  if (local_78._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_68.field_2._M_allocated_capacity);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_48,(Message *)&local_68.field_2._M_allocated_capacity);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                         local_68.field_2._M_allocated_capacity._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                                     local_68.field_2._M_allocated_capacity._0_4_) + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or(&local_38);
  return;
}

Assistant:

TEST_F (ServeStaticContent, MissingFile) {
    pstore::error_or<std::string> const actual = serve_path ("/foo.html");
    EXPECT_EQ (actual.get_error (), make_error_code (pstore::romfs::error_code::enoent));
}